

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

string * __thiscall nite::Color::str_abi_cxx11_(string *__return_storage_ptr__,Color *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string local_188;
  string local_168;
  string local_148;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Color *local_18;
  Color *this_local;
  
  local_18 = this;
  this_local = (Color *)__return_storage_ptr__;
  toStr_abi_cxx11_(&local_118,(nite *)this,(double)this->r);
  std::operator+(&local_f8,"(",&local_118);
  pbVar1 = &local_f8;
  std::operator+(&local_d8,pbVar1,", ");
  toStr_abi_cxx11_(&local_148,(nite *)pbVar1,(double)this->g);
  std::operator+(&local_b8,&local_d8,&local_148);
  pbVar1 = &local_b8;
  std::operator+(&local_98,pbVar1,", ");
  toStr_abi_cxx11_(&local_168,(nite *)pbVar1,(double)this->b);
  std::operator+(&local_78,&local_98,&local_168);
  pbVar1 = &local_78;
  std::operator+(&local_58,pbVar1,", ");
  toStr_abi_cxx11_(&local_188,(nite *)pbVar1,(double)this->a);
  std::operator+(&local_38,&local_58,&local_188);
  std::operator+(__return_storage_ptr__,&local_38,")");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

String nite::Color::str(){
	return "("+toStr(r)+", "+toStr(g)+", "+toStr(b)+", "+toStr(a)+")";
}